

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)400>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  GLMClassifier *pGVar4;
  Type *pTVar5;
  LogMessage *other;
  long lVar6;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features;
  int iVar7;
  ModelDescription *from;
  _Alloc_hider _Var8;
  undefined1 in_R9B;
  Result result;
  RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray> weights;
  GLMClassifier glmClassifier;
  ModelDescription interface;
  undefined1 local_198 [56];
  _func_int **local_160;
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  RepeatedPtrFieldBase local_138;
  string local_120;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  undefined1 local_f0 [24];
  int local_d8;
  uint local_c4;
  uint local_c0;
  ClassLabelsUnion local_b8;
  uint32 local_ac [1];
  undefined1 local_a8 [120];
  
  from = format->description_;
  if (from == (ModelDescription *)0x0) {
    from = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Specification::ModelDescription::ModelDescription((ModelDescription *)local_a8,from);
  if (format->_oneof_case_[0] == 400) {
    pGVar4 = (GLMClassifier *)(format->Type_).pipelineclassifier_;
  }
  else {
    pGVar4 = Specification::GLMClassifier::default_instance();
  }
  validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::GLMClassifier>
            ((Result *)&local_160,(CoreML *)format,(Model *)pGVar4,(GLMClassifier *)0x0,false,
             (bool)in_R9B);
  bVar3 = Result::good((Result *)&local_160);
  if (bVar3) {
    validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_100,(CoreML *)(local_a8 + 0x10),features);
    local_160 = (_func_int **)local_100;
    std::__cxx11::string::operator=((string *)&local_158,(string *)&local_f8);
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT44(local_f0._12_4_,local_f0._8_4_) + 1);
    }
    bVar3 = Result::good((Result *)&local_160);
    if (bVar3) {
      if (format->_oneof_case_[0] == 400) {
        pGVar4 = (format->Type_).glmclassifier_;
      }
      else {
        pGVar4 = Specification::GLMClassifier::default_instance();
      }
      Specification::GLMClassifier::GLMClassifier((GLMClassifier *)local_100,pGVar4);
      if (local_c4 < 2) {
        if (1 < local_c0) {
          local_198._0_8_ = local_198 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,"Invalid class encoding","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_198);
          goto LAB_0027c0e2;
        }
        if (local_f0._8_4_ == 0) {
          local_198._0_8_ = local_198 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,
                     "The number of DoubleArrays in weights must be greater than zero","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_198);
          goto LAB_0027c0e2;
        }
        if (local_f0._8_4_ != local_d8) {
          local_198._0_8_ = local_198 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,
                     "The number of DoubleArrays in weights must match number of offsets","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_198);
          goto LAB_0027c0e2;
        }
        if (local_ac[0] == 0x65) {
          lVar6 = 0x10;
LAB_0027bea4:
          iVar7 = *(int *)((long)&((local_b8.stringclasslabels_)->super_MessageLite).
                                  _vptr_MessageLite + lVar6);
        }
        else {
          iVar7 = -1;
          if (local_ac[0] == 100) {
            lVar6 = 0x18;
            goto LAB_0027bea4;
          }
        }
        if (local_c0 == 0) {
          if (local_f0._8_4_ == iVar7 + -1 || iVar7 == -1) goto LAB_0027bf56;
          local_198._0_8_ = local_198 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,
                     "With ReferenceClass encoding the number of DoubleArrays in weights must be one less than number of classes"
                     ,"");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_198);
          goto LAB_0027c0e2;
        }
        if (iVar7 != -1) {
          if (iVar7 == 2) {
            if (local_f0._8_4_ == 1) goto LAB_0027bf56;
            local_198._0_8_ = local_198 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_198,
                       "When using OneVsRest encoding for only two classes, the number of DoubleArrays in weights must be one"
                       ,"");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_198);
          }
          else {
            if (local_f0._8_4_ == iVar7) goto LAB_0027bf56;
            local_198._0_8_ = local_198 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_198,
                       "With OneVsRest encoding the number of DoubleArrays in weights must equal the number of classes"
                       ,"");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_198);
          }
          goto LAB_0027c0e2;
        }
LAB_0027bf56:
        if ((2 < iVar7) && (local_c4 == 1)) {
          local_198._0_8_ = local_198 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,
                     "Probit post evaluation transform is only supported for binary classification",
                     "");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_198);
          goto LAB_0027c0e2;
        }
        local_138.arena_ = (Arena *)0x0;
        local_138.current_size_ = 0;
        local_138.total_size_ = 0;
        local_138.rep_ = (Rep *)0x0;
        google::protobuf::internal::RepeatedPtrFieldBase::
        MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                  (&local_138,(RepeatedPtrFieldBase *)local_f0);
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                           (&local_138,0);
        if ((pTVar5->value_).current_size_ == 0) {
          local_198._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_198 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,"Weight DoubleArrays must have nonzero length","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_198);
          _Var8._M_p = (pointer)local_198._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_198 + 0x10)) {
LAB_0027c18a:
            operator_delete(_Var8._M_p,local_198._16_8_ + 1);
          }
        }
        else {
          if (1 < local_138.current_size_) {
            iVar7 = 1;
            do {
              if (local_138.current_size_ < 1) {
                google::protobuf::internal::LogMessage::LogMessage
                          ((LogMessage *)local_198,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                           ,0x5d3);
                other = google::protobuf::internal::LogMessage::operator<<
                                  ((LogMessage *)local_198,
                                   "CHECK failed: (index) < (current_size_): ");
                google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_120,other);
                google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_198);
              }
              iVar2 = *(int *)((long)(local_138.rep_)->elements[0] + 0x10);
              pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                       Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                                 (&local_138,iVar7);
              if (iVar2 != (pTVar5->value_).current_size_) {
                local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_120,"Weight DoubleArrays must have the same length","");
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_120);
                local_198._16_8_ = local_120.field_2._M_allocated_capacity;
                _Var8._M_p = local_120._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._M_dataplus._M_p != &local_120.field_2) goto LAB_0027c18a;
                goto LAB_0027c192;
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 < local_138.current_size_);
          }
          Result::Result(__return_storage_ptr__);
        }
LAB_0027c192:
        google::protobuf::internal::RepeatedPtrFieldBase::
        Destroy<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                  (&local_138);
      }
      else {
        local_198._0_8_ = local_198 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_198,"Invalid post evaluation transform","");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_198);
LAB_0027c0e2:
        if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
          operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
        }
      }
      Specification::GLMClassifier::~GLMClassifier((GLMClassifier *)local_100);
      goto LAB_0027c105;
    }
  }
  *(_func_int ***)__return_storage_ptr__ = local_160;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_p == &local_148) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_148._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_158._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_158._M_p = (pointer)&local_148;
LAB_0027c105:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_p != &local_148) {
    operator_delete(local_158._M_p,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  Specification::ModelDescription::~ModelDescription((ModelDescription *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_glmClassifier>(const Specification::Model& format) {

        // Check has a classifier interface
        Specification::ModelDescription interface = format.description();
        Result result = validateClassifierInterface(format, format.glmclassifier());
        if (!result.good()) {
            return result;
        }
        
        // Check that inputs are vectorizable
        result = validateDescriptionsAreAllVectorizableTypes(interface.input());
        if (!result.good()) {
            return result;
        }

        Specification::GLMClassifier glmClassifier = format.glmclassifier();

        // Check PostEvluationTransfrom and ClassEncoding have allowed values
        if(glmClassifier.postevaluationtransform() != Specification::GLMClassifier::Logit
           && glmClassifier.postevaluationtransform() != Specification::GLMClassifier::Probit) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Invalid post evaluation transform");
        }
        if(glmClassifier.classencoding() != Specification::GLMClassifier::ReferenceClass
           && glmClassifier.classencoding() != Specification::GLMClassifier::OneVsRest) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Invalid class encoding");
        }

        // Check has weights and same size as offsets
        int numCoefficient = glmClassifier.weights_size();
        if(numCoefficient == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The number of DoubleArrays in weights must be greater than zero");
        }
        if(numCoefficient != glmClassifier.offset_size()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The number of DoubleArrays in weights must match number of offsets");
        }

        // Check number of weight vector makes sense based on the number of classes and the class encoding
        int numClasses;
        switch (glmClassifier.ClassLabels_case()) {
            case Specification::GLMClassifier::kInt64ClassLabels:
                numClasses = glmClassifier.int64classlabels().vector_size();
                break;
            case Specification::GLMClassifier::kStringClassLabels:
                numClasses = glmClassifier.stringclasslabels().vector_size();
                break;
            case Specification::GLMClassifier::CLASSLABELS_NOT_SET:
                numClasses = -1;
                break;
        }
        if(glmClassifier.classencoding() == Specification::GLMClassifier::ReferenceClass) {
            if (numClasses != -1 && numCoefficient != numClasses - 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "With ReferenceClass encoding the number of DoubleArrays in weights must be one less than number of classes");
            }
        } else { // One vs Rest encoding
            if(numClasses == 2) {
                if(numCoefficient != 1) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "When using OneVsRest encoding for only two classes, the number of DoubleArrays in weights must be one");
                }
            } else if (numClasses != -1 && numCoefficient != numClasses) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "With OneVsRest encoding the number of DoubleArrays in weights must equal the number of classes");
            }
        }

        // Probit is only supported for binary classification
        if(numClasses > 2 && glmClassifier.postevaluationtransform() == Specification::GLMClassifier::Probit) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Probit post evaluation transform is only supported for binary classification");
        }

        // Check all DoubleArrays in weights have the same, nonzero length
        auto weights = glmClassifier.weights();
        if(weights[0].value_size() == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Weight DoubleArrays must have nonzero length");
        }
        for(int i = 1; i < weights.size(); i++) {
            if(weights[0].value_size() != weights[i].value_size()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Weight DoubleArrays must have the same length");
            }
        }

        return Result();
    }